

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_get_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  connectdata *pcVar1;
  FTP *pFVar2;
  curl_off_t cVar3;
  CURLcode CVar4;
  connectdata *conn;
  char *pcVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  connectdata *conn_1;
  _Bool connected;
  curl_off_t size;
  _Bool local_29;
  curl_off_t local_28;
  
  pcVar1 = data->conn;
  pFVar2 = (data->req).p.ftp;
  if ((ftpcode != 0x96) && (ftpcode != 0x7d)) {
    if (ftpcode == 0x1c2 && instate == FTP_LIST) {
      pFVar2->transfer = PPTRANSFER_NONE;
      (pcVar1->proto).ftpc.state = FTP_STOP;
      return CURLE_OK;
    }
    Curl_failf(data,"RETR response: %03d",(ulong)(uint)ftpcode);
    if (ftpcode == 0x226 && instate == FTP_RETR) {
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    return CURLE_FTP_COULDNT_RETR_FILE;
  }
  local_28 = -1;
  if (((instate == FTP_LIST) || (((data->state).field_0x6d1 & 0x80) != 0)) ||
     (0 < pFVar2->downloadsize)) {
    lVar6 = pFVar2->downloadsize;
    cVar3 = lVar6;
    if (lVar6 < 0) {
LAB_0054b10b:
      lVar6 = -1;
      cVar3 = local_28;
    }
LAB_0054b112:
    local_28 = cVar3;
    lVar7 = (data->req).maxdownload;
    if (lVar7 < lVar6 && 0 < lVar7) {
      (data->req).size = lVar7;
      local_28 = lVar7;
      Curl_infof(data,"Maxdownload = %ld");
      if (instate == FTP_LIST) goto LAB_0054b19d;
      goto LAB_0054b187;
    }
    if (instate != FTP_LIST) {
      if (((data->state).field_0x6d1 & 0x80) != 0) {
        local_28 = -1;
      }
      goto LAB_0054b176;
    }
    pcVar8 = "Maxdownload = %ld";
  }
  else {
    pcVar8 = (data->state).buffer;
    pcVar5 = strstr(pcVar8," bytes");
    if (pcVar5 != (char *)0x0) {
      pcVar9 = pcVar5 + -1;
      if (pcVar9 + ~(ulong)pcVar8 != (char *)0x0) {
        pcVar8 = pcVar8 + (2 - (long)pcVar5);
        do {
          if (*pcVar9 == '(') break;
          if (9 < (byte)(*pcVar9 - 0x30U)) goto LAB_0054b10b;
          pcVar9 = pcVar9 + -1;
          pcVar8 = pcVar8 + 1;
        } while (pcVar8 != (char *)0x0);
      }
      curlx_strtoofft(pcVar9 + 1,(char **)0x0,0,&local_28);
      lVar6 = local_28;
      cVar3 = local_28;
      goto LAB_0054b112;
    }
    lVar7 = (data->req).maxdownload;
LAB_0054b176:
    Curl_infof(data,"Maxdownload = %ld",lVar7);
LAB_0054b187:
    pcVar8 = "Getting file with size: %ld";
    lVar7 = local_28;
  }
  Curl_infof(data,pcVar8,lVar7);
LAB_0054b19d:
  (pcVar1->proto).ftpc.state_saved = instate;
  (pcVar1->proto).ftpc.retr_size_saved = local_28;
  if (((data->set).field_0x8e3 & 4) == 0) {
    CVar4 = InitiateTransfer(data);
    return CVar4;
  }
  CVar4 = AllowServerConnect(data,&local_29);
  if (CVar4 == CURLE_OK) {
    if (local_29 == false) {
      Curl_infof(data,"Data conn was not available immediately");
      (data->conn->proto).ftpc.state = FTP_STOP;
      (pcVar1->proto).ftpc.wait_data_conn = true;
    }
    return CURLE_OK;
  }
  return CVar4;
}

Assistant:

static CURLcode ftp_state_get_resp(struct Curl_easy *data,
                                   int ftpcode,
                                   ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;

  if((ftpcode == 150) || (ftpcode == 125)) {

    /*
      A;
      150 Opening BINARY mode data connection for /etc/passwd (2241
      bytes).  (ok, the file is being transferred)

      B:
      150 Opening ASCII mode data connection for /bin/ls

      C:
      150 ASCII data connection for /bin/ls (137.167.104.91,37445) (0 bytes).

      D:
      150 Opening ASCII mode data connection for [file] (0.0.0.0,0) (545 bytes)

      E:
      125 Data connection already open; Transfer starting. */

    curl_off_t size = -1; /* default unknown size */


    /*
     * It appears that there are FTP-servers that return size 0 for files when
     * SIZE is used on the file while being in BINARY mode. To work around
     * that (stupid) behavior, we attempt to parse the RETR response even if
     * the SIZE returned size zero.
     *
     * Debugging help from Salvatore Sorrentino on February 26, 2003.
     */

    if((instate != FTP_LIST) &&
       !data->state.prefer_ascii &&
       (ftp->downloadsize < 1)) {
      /*
       * It seems directory listings either don't show the size or very
       * often uses size 0 anyway. ASCII transfers may very well turn out
       * that the transferred amount of data is not the same as this line
       * tells, why using this number in those cases only confuses us.
       *
       * Example D above makes this parsing a little tricky */
      char *bytes;
      char *buf = data->state.buffer;
      bytes = strstr(buf, " bytes");
      if(bytes) {
        long in = (long)(--bytes-buf);
        /* this is a hint there is size information in there! ;-) */
        while(--in) {
          /* scan for the left parenthesis and break there */
          if('(' == *bytes)
            break;
          /* skip only digits */
          if(!ISDIGIT(*bytes)) {
            bytes = NULL;
            break;
          }
          /* one more estep backwards */
          bytes--;
        }
        /* if we have nothing but digits: */
        if(bytes) {
          ++bytes;
          /* get the number! */
          (void)curlx_strtoofft(bytes, NULL, 0, &size);
        }
      }
    }
    else if(ftp->downloadsize > -1)
      size = ftp->downloadsize;

    if(size > data->req.maxdownload && data->req.maxdownload > 0)
      size = data->req.size = data->req.maxdownload;
    else if((instate != FTP_LIST) && (data->state.prefer_ascii))
      size = -1; /* kludge for servers that understate ASCII mode file size */

    infof(data, "Maxdownload = %" CURL_FORMAT_CURL_OFF_T,
          data->req.maxdownload);

    if(instate != FTP_LIST)
      infof(data, "Getting file with size: %" CURL_FORMAT_CURL_OFF_T,
            size);

    /* FTP download: */
    conn->proto.ftpc.state_saved = instate;
    conn->proto.ftpc.retr_size_saved = size;

    if(data->set.ftp_use_port) {
      bool connected;

      result = AllowServerConnect(data, &connected);
      if(result)
        return result;

      if(!connected) {
        struct ftp_conn *ftpc = &conn->proto.ftpc;
        infof(data, "Data conn was not available immediately");
        state(data, FTP_STOP);
        ftpc->wait_data_conn = TRUE;
      }
    }
    else
      return InitiateTransfer(data);
  }
  else {
    if((instate == FTP_LIST) && (ftpcode == 450)) {
      /* simply no matching files in the dir listing */
      ftp->transfer = PPTRANSFER_NONE; /* don't download anything */
      state(data, FTP_STOP); /* this phase is over */
    }
    else {
      failf(data, "RETR response: %03d", ftpcode);
      return instate == FTP_RETR && ftpcode == 550?
        CURLE_REMOTE_FILE_NOT_FOUND:
        CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  return result;
}